

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O0

path_alias * __thiscall
xray_re::xr_file_system::add_path_alias(xr_file_system *this,string *path,string *root,string *add)

{
  char *pcVar1;
  path_alias *this_00;
  path_alias *local_40;
  path_alias *new_pa;
  path_alias *pa;
  string *add_local;
  string *root_local;
  string *path_local;
  xr_file_system *this_local;
  
  pa = (path_alias *)add;
  add_local = root;
  root_local = path;
  path_local = (string *)this;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  new_pa = find_path_alias(this,pcVar1);
  if (new_pa != (path_alias *)0x0) {
    __assert_fail("pa == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_file_system.cxx"
                  ,0x3a,
                  "xr_file_system::path_alias *xray_re::xr_file_system::add_path_alias(const std::string &, const std::string &, const std::string &)"
                 );
  }
  this_00 = (path_alias *)operator_new(0x80);
  path_alias::path_alias(this_00);
  local_40 = this_00;
  std::
  vector<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
  ::push_back(&this->m_aliases,&local_40);
  std::__cxx11::string::operator=((string *)local_40,(string *)root_local);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  new_pa = find_path_alias(this,pcVar1);
  if (new_pa == (path_alias *)0x0) {
    std::__cxx11::string::operator=((string *)&local_40->root,(string *)add_local);
    append_path_separator(&local_40->root);
  }
  else {
    std::__cxx11::string::operator=((string *)&local_40->root,(string *)&new_pa->root);
  }
  std::__cxx11::string::operator+=((string *)&local_40->root,(string *)pa);
  append_path_separator(&local_40->root);
  return local_40;
}

Assistant:

xr_file_system::path_alias* xr_file_system::add_path_alias(const std::string& path,
		const std::string& root, const std::string& add)
{
	const path_alias* pa = find_path_alias(path.c_str());
	assert(pa == 0);
	if (pa != 0)
		return 0;

	path_alias* new_pa = new path_alias;
	m_aliases.push_back(new_pa);
	new_pa->path = path;
	pa = find_path_alias(root.c_str());
	if (pa) {
		new_pa->root = pa->root;
	} else {
		new_pa->root = root;
		append_path_separator(new_pa->root);
	}
	new_pa->root += add;
	append_path_separator(new_pa->root);
	return new_pa;
}